

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitExtGNU_AsmStatement(SyntaxDumper *this,ExtGNU_AsmStatementSyntax *node)

{
  long lVar1;
  ExtGNU_AsmStatementSyntax *pEVar2;
  ExtGNU_AsmStatementSyntax aEStack_58 [56];
  
  ExtGNU_AsmStatementSyntax::asmKeyword(aEStack_58);
  (**(code **)(*(long *)this + 0x2e8))(this,aEStack_58,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)aEStack_58);
  pEVar2 = node + 0x20;
  while (lVar1 = *(long *)pEVar2, lVar1 != 0) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(lVar1 + 8));
    pEVar2 = (ExtGNU_AsmStatementSyntax *)(lVar1 + 0x10);
  }
  ExtGNU_AsmStatementSyntax::openParenthesisToken(aEStack_58);
  (**(code **)(*(long *)this + 0x2e8))(this,aEStack_58,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)aEStack_58);
  (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(node + 0x30));
  ExtGNU_AsmStatementSyntax::colon1Token(aEStack_58);
  (**(code **)(*(long *)this + 0x2e8))(this,aEStack_58,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)aEStack_58);
  pEVar2 = node + 0x40;
  while (lVar1 = *(long *)pEVar2, lVar1 != 0) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(lVar1 + 8));
    psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax*>::delimiterToken();
    (**(code **)(*(long *)this + 0x2e8))(this,aEStack_58,node);
    psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)aEStack_58);
    pEVar2 = (ExtGNU_AsmStatementSyntax *)(lVar1 + 0x10);
  }
  ExtGNU_AsmStatementSyntax::colon2Token(aEStack_58);
  (**(code **)(*(long *)this + 0x2e8))(this,aEStack_58,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)aEStack_58);
  pEVar2 = node + 0x50;
  while (lVar1 = *(long *)pEVar2, lVar1 != 0) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(lVar1 + 8));
    psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax*>::delimiterToken();
    (**(code **)(*(long *)this + 0x2e8))(this,aEStack_58,node);
    psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)aEStack_58);
    pEVar2 = (ExtGNU_AsmStatementSyntax *)(lVar1 + 0x10);
  }
  ExtGNU_AsmStatementSyntax::colon3Token(aEStack_58);
  (**(code **)(*(long *)this + 0x2e8))(this,aEStack_58,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)aEStack_58);
  pEVar2 = node + 0x60;
  while (lVar1 = *(long *)pEVar2, lVar1 != 0) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(lVar1 + 8));
    psy::C::SyntaxNodeSeparatedList<psy::C::ExpressionSyntax*>::delimiterToken();
    (**(code **)(*(long *)this + 0x2e8))(this,aEStack_58,node);
    psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)aEStack_58);
    pEVar2 = (ExtGNU_AsmStatementSyntax *)(lVar1 + 0x10);
  }
  ExtGNU_AsmStatementSyntax::colon4Token(aEStack_58);
  (**(code **)(*(long *)this + 0x2e8))(this,aEStack_58,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)aEStack_58);
  pEVar2 = node + 0x70;
  while (lVar1 = *(long *)pEVar2, lVar1 != 0) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(lVar1 + 8));
    psy::C::SyntaxNodeSeparatedList<psy::C::ExpressionSyntax*>::delimiterToken();
    (**(code **)(*(long *)this + 0x2e8))(this,aEStack_58,node);
    psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)aEStack_58);
    pEVar2 = (ExtGNU_AsmStatementSyntax *)(lVar1 + 0x10);
  }
  ExtGNU_AsmStatementSyntax::closeParenthesisToken(aEStack_58);
  (**(code **)(*(long *)this + 0x2e8))(this,aEStack_58,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)aEStack_58);
  ExtGNU_AsmStatementSyntax::semicolonToken(aEStack_58);
  (**(code **)(*(long *)this + 0x2e8))(this,aEStack_58,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)aEStack_58);
  return Skip;
}

Assistant:

virtual Action visitExtGNU_AsmStatement(const ExtGNU_AsmStatementSyntax* node) override
    {
        terminal(node->asmKeyword(), node);
        for (auto it = node->asmQualifiers(); it; it = it->next)
            nonterminal(it->value);
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->stringLiteral());
        terminal(node->colon1Token(), node);
        for (auto it = node->outputOperands(); it; it = it->next) {
            nonterminal(it->value);
            terminal(it->delimiterToken(), node);
        }
        terminal(node->colon2Token(), node);
        for (auto it = node->inputOperands(); it; it = it->next) {
            nonterminal(it->value);
            terminal(it->delimiterToken(), node);
        }
        terminal(node->colon3Token(), node);
        for (auto it = node->clobbers(); it; it = it->next) {
            nonterminal(it->value);
            terminal(it->delimiterToken(), node);
        }
        terminal(node->colon4Token(), node);
        for (auto it = node->gotoLabels(); it; it = it->next) {
            nonterminal(it->value);
            terminal(it->delimiterToken(), node);
        }
        terminal(node->closeParenthesisToken(), node);
        terminal(node->semicolonToken(), node);
        return Action::Skip;
    }